

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O1

string * __thiscall
flatbuffers::dart::DartGenerator::GenType_abi_cxx11_
          (string *__return_storage_ptr__,DartGenerator *this,Type *type)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  char *pcVar4;
  char *pcVar5;
  Type local_30;
  
  switch(type->base_type) {
  case BASE_TYPE_UTYPE:
  case BASE_TYPE_UCHAR:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "Uint8";
    pcVar4 = "";
    break;
  case BASE_TYPE_BOOL:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "Bool";
    pcVar4 = "";
    break;
  case BASE_TYPE_CHAR:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "Int8";
    pcVar4 = "";
    break;
  case BASE_TYPE_SHORT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "Int16";
    pcVar4 = "";
    break;
  case BASE_TYPE_USHORT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "Uint16";
    pcVar4 = "";
    break;
  case BASE_TYPE_INT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "Int32";
    pcVar4 = "";
    break;
  case BASE_TYPE_UINT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "Uint32";
    pcVar4 = "";
    break;
  case BASE_TYPE_LONG:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "Int64";
    pcVar4 = "";
    break;
  case BASE_TYPE_ULONG:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "Uint64";
    pcVar4 = "";
    break;
  case BASE_TYPE_FLOAT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "Float32";
    pcVar4 = "";
    break;
  case BASE_TYPE_DOUBLE:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "Float64";
    pcVar4 = "";
    break;
  case BASE_TYPE_STRING:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "String";
    pcVar4 = "";
    break;
  case BASE_TYPE_VECTOR:
    local_30.base_type = type->element;
    local_30.struct_def = type->struct_def;
    local_30.enum_def = type->enum_def;
    local_30.fixed_length = type->fixed_length;
    local_30.element = BASE_TYPE_NONE;
    GenType_abi_cxx11_(__return_storage_ptr__,this,&local_30);
    return __return_storage_ptr__;
  case BASE_TYPE_STRUCT:
    (*(this->namer_).super_Namer._vptr_Namer[0xf])
              (__return_storage_ptr__,&this->namer_,type->struct_def);
    return __return_storage_ptr__;
  case BASE_TYPE_UNION:
    (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_30,&this->namer_,type->enum_def);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_30);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar3) {
      lVar1 = plVar2[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    }
    __return_storage_ptr__->_M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((EnumDef **)CONCAT44(local_30.element,local_30.base_type) == &local_30.enum_def) {
      return __return_storage_ptr__;
    }
    operator_delete((undefined1 *)CONCAT44(local_30.element,local_30.base_type),
                    (ulong)((long)&((local_30.enum_def)->super_Definition).name._M_dataplus._M_p + 1
                           ));
    return __return_storage_ptr__;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "Table";
    pcVar4 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string GenType(const Type &type) {
    switch (type.base_type) {
      case BASE_TYPE_BOOL: return "Bool";
      case BASE_TYPE_CHAR: return "Int8";
      case BASE_TYPE_UTYPE:
      case BASE_TYPE_UCHAR: return "Uint8";
      case BASE_TYPE_SHORT: return "Int16";
      case BASE_TYPE_USHORT: return "Uint16";
      case BASE_TYPE_INT: return "Int32";
      case BASE_TYPE_UINT: return "Uint32";
      case BASE_TYPE_LONG: return "Int64";
      case BASE_TYPE_ULONG: return "Uint64";
      case BASE_TYPE_FLOAT: return "Float32";
      case BASE_TYPE_DOUBLE: return "Float64";
      case BASE_TYPE_STRING: return "String";
      case BASE_TYPE_VECTOR: return GenType(type.VectorType());
      case BASE_TYPE_STRUCT: return namer_.Type(*type.struct_def);
      case BASE_TYPE_UNION: return namer_.Type(*type.enum_def) + "TypeId";
      default: return "Table";
    }
  }